

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int i;
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  long lVar4;
  code *pcVar5;
  long lVar6;
  double extraout_XMM0_Qa;
  uint domain_id;
  double local_20f0;
  void *coreclr_handle;
  sum_ptr dele_sum;
  string coreclr_path;
  string tpa_list;
  bootstrap_ptr dele_bootstrap;
  char *property_values [2];
  char *property_keys [2];
  char pkg_path [4096];
  char app_path [4096];
  
  if (argc != 2) {
    poVar3 = (ostream *)&std::cerr;
    pcVar2 = "Usage: host <core_clr_path>";
LAB_00103a33:
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    return -1;
  }
  pcVar2 = realpath(*argv,app_path);
  if (pcVar2 == (char *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"bad path ");
    pcVar2 = *argv;
    goto LAB_00103a33;
  }
  pcVar2 = strrchr(app_path,0x2f);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"app_path:");
  poVar3 = std::operator<<(poVar3,app_path);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading CoreCLR...");
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar2 = realpath(argv[1],pkg_path);
  if (pcVar2 == (char *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"bad path ");
    pcVar2 = argv[1];
    goto LAB_00103a33;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&coreclr_path,pkg_path,(allocator<char> *)&dele_bootstrap);
  std::__cxx11::string::append((char *)&coreclr_path);
  std::__cxx11::string::append((string *)&coreclr_path);
  poVar3 = std::operator<<((ostream *)&std::cout,"coreclr_path:");
  poVar3 = std::operator<<(poVar3,coreclr_path._M_dataplus._M_p);
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar4 = dlopen(coreclr_path._M_dataplus._M_p,2);
  if (lVar4 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"failed to open ");
    poVar3 = std::operator<<(poVar3,(string *)&coreclr_path);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,"error: ");
    pcVar2 = (char *)dlerror();
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Initializing CoreCLR...");
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar5 = (code *)dlsym(lVar4,"coreclr_initialize");
    if (pcVar5 != (code *)0x0) {
      tpa_list._M_dataplus._M_p = (pointer)&tpa_list.field_2;
      tpa_list._M_string_length = 0;
      tpa_list.field_2._M_local_buf[0] = '\0';
      AddFilesFromDirectoryToTpaList(pkg_path,&tpa_list);
      property_keys[0] = "APP_PATHS";
      property_keys[1] = "TRUSTED_PLATFORM_ASSEMBLIES";
      property_values[1] = tpa_list._M_dataplus._M_p;
      property_values[0] = app_path;
      iVar1 = (*pcVar5)(app_path,"host",2,property_keys,property_values,&coreclr_handle,&domain_id);
      if (iVar1 < 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"failed to initialize coreclr. cerr = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        std::endl<char,std::char_traits<char>>(poVar3);
LAB_00103cd1:
        iVar1 = -1;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Creating delegate...");
        std::endl<char,std::char_traits<char>>(poVar3);
        pcVar5 = (code *)dlsym(lVar4,"coreclr_create_delegate");
        if (pcVar5 == (code *)0x0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "couldn\'t find coreclr_create_delegate in ");
          poVar3 = std::operator<<(poVar3,(string *)&coreclr_path);
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_00103cd1;
        }
        iVar1 = (*pcVar5)(coreclr_handle,domain_id,"manlib","ManLib","Bootstrap",&dele_bootstrap);
        if (iVar1 < 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"couldn\'t create delegate. err = ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_00103cd1;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Calling ManLib::Bootstrap() through delegate...");
        std::endl<char,std::char_traits<char>>(poVar3);
        pcVar2 = (*dele_bootstrap)();
        poVar3 = std::operator<<((ostream *)&std::cout,"ManLib::Bootstrap() returned ");
        poVar3 = std::operator<<(poVar3,pcVar2);
        std::endl<char,std::char_traits<char>>(poVar3);
        free(pcVar2);
        iVar1 = (*pcVar5)(coreclr_handle,domain_id,"manlib","ManLib","Plus",&dele_bootstrap);
        if (iVar1 < 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"couldn\'t create delegate. err = ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_00103cd1;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"Calling ManLib::Plus() through delegate...")
        ;
        std::endl<char,std::char_traits<char>>(poVar3);
        (*dele_bootstrap)(0x3ff0000000000000,0x4000000000000000);
        local_20f0 = extraout_XMM0_Qa;
        std::operator<<((ostream *)&std::cout,"ManLib::Plus(1, 2) returned ");
        poVar3 = std::ostream::_M_insert<double>(local_20f0);
        std::endl<char,std::char_traits<char>>(poVar3);
        iVar1 = (*pcVar5)(coreclr_handle,domain_id,"manlib","ManLib","Sum",&dele_sum);
        if (iVar1 < 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"couldn\'t create delegate. err = ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_00103cd1;
        }
        for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
          (&dele_bootstrap)[lVar6] = (bootstrap_ptr)(double)(int)lVar6;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"Calling ManLib::Sum() through delegate...");
        std::endl<char,std::char_traits<char>>(poVar3);
        local_20f0 = (*dele_sum)((double *)&dele_bootstrap,10);
        std::operator<<((ostream *)&std::cout,"ManLib::Sum(1:10, 10) returned ");
        poVar3 = std::ostream::_M_insert<double>(local_20f0);
        std::endl<char,std::char_traits<char>>(poVar3);
        iVar1 = (*pcVar5)(coreclr_handle,domain_id,"manlib","ManLib","Sum2",&dele_sum);
        if (iVar1 < 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"couldn\'t create delegate. err = ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_00103cd1;
        }
        for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
          (&dele_bootstrap)[lVar6] = (bootstrap_ptr)(double)(int)lVar6;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"Calling ManLib::Sum2() through delegate...")
        ;
        std::endl<char,std::char_traits<char>>(poVar3);
        local_20f0 = (*dele_sum)((double *)&dele_bootstrap,10);
        std::operator<<((ostream *)&std::cout,"ManLib::Sum2(1:10, 10) returned ");
        poVar3 = std::ostream::_M_insert<double>(local_20f0);
        std::endl<char,std::char_traits<char>>(poVar3);
        dlclose(lVar4);
        iVar1 = 0;
      }
      std::__cxx11::string::~string((string *)&tpa_list);
      goto LAB_00103cde;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"couldn\'t find coreclr_initialize in ");
    poVar3 = std::operator<<(poVar3,(string *)&coreclr_path);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  iVar1 = -1;
LAB_00103cde:
  std::__cxx11::string::~string((string *)&coreclr_path);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc != 2) {
    cerr << "Usage: host <core_clr_path>" << endl;
    return -1;
  }

  char app_path[PATH_MAX];
  if (realpath(argv[0], app_path) == NULL) {
    cerr << "bad path " << argv[0] << endl;
    return -1;
  }

  char *last_slash = strrchr(app_path, '/');
  if (last_slash != NULL)
    *last_slash = 0;

  cout << "app_path:" << app_path << endl;

  cout << "Loading CoreCLR..." << endl;

  char pkg_path[PATH_MAX];
  if (realpath(argv[1], pkg_path) == NULL) {
    cerr << "bad path " << argv[1] << endl;
    return -1;
  }

  //
  // Load CoreCLR
  //
  string coreclr_path(pkg_path);
  coreclr_path.append("/");
  coreclr_path.append(libcoreclr);

  cout << "coreclr_path:" << coreclr_path.c_str() << endl;

  void *coreclr = dlopen(coreclr_path.c_str(), RTLD_NOW | RTLD_LOCAL);
  if (coreclr == NULL) {
    cerr << "failed to open " << coreclr_path << endl;
    cerr << "error: " << dlerror() << endl;
    return -1;
  }

  //
  // Initialize CoreCLR
  //
  std::cout << "Initializing CoreCLR..." << endl;

  coreclr_initialize_ptr coreclr_init =
      reinterpret_cast<coreclr_initialize_ptr>(
          dlsym(coreclr, "coreclr_initialize"));
  if (coreclr_init == NULL) {
    cerr << "couldn't find coreclr_initialize in " << coreclr_path << endl;
    return -1;
  }

  string tpa_list;
  AddFilesFromDirectoryToTpaList(pkg_path, tpa_list);

  const char *property_keys[] = {"APP_PATHS", "TRUSTED_PLATFORM_ASSEMBLIES"};
  const char *property_values[] = {// APP_PATHS
                                   app_path,
                                   // TRUSTED_PLATFORM_ASSEMBLIES
                                   tpa_list.c_str()};

  void *coreclr_handle;
  unsigned int domain_id;
  int ret =
      coreclr_init(app_path, // exePath
                   "host",   // appDomainFriendlyName
                   sizeof(property_values) / sizeof(char *), // propertyCount
                   property_keys,                            // propertyKeys
                   property_values,                          // propertyValues
                   &coreclr_handle,                          // hostHandle
                   &domain_id                                // domainId
      );
  if (ret < 0) {
    cerr << "failed to initialize coreclr. cerr = " << ret << endl;
    return -1;
  }

  //
  // Once CoreCLR is initialized, bind to the delegate
  //
  std::cout << "Creating delegate..." << endl;
  coreclr_create_delegate_ptr coreclr_create_dele =
      reinterpret_cast<coreclr_create_delegate_ptr>(
          dlsym(coreclr, "coreclr_create_delegate"));
  if (coreclr_create_dele == NULL) {
    cerr << "couldn't find coreclr_create_delegate in " << coreclr_path << endl;
    return -1;
  }

  {
    // Create the delegate to ManLib::Bootstrap()
    bootstrap_ptr dele_bootstrap;
    ret = coreclr_create_dele(coreclr_handle, domain_id, "manlib", "ManLib",
                              "Bootstrap",
                              reinterpret_cast<void **>(&dele_bootstrap));
    if (ret < 0) {
      cerr << "couldn't create delegate. err = " << ret << endl;
      return -1;
    }

    // Call the delegate to ManLib::Bootstrap()
    cout << "Calling ManLib::Bootstrap() through delegate..." << endl;

    char *msg = dele_bootstrap();
    cout << "ManLib::Bootstrap() returned " << msg << endl;
    free(msg); // returned string need to be free-ed
  }

  {
    // Create the delegate to ManLib::Plus()
    plus_ptr dele_plus;
    ret = coreclr_create_dele(coreclr_handle, domain_id, "manlib", "ManLib",
                              "Plus", reinterpret_cast<void **>(&dele_plus));
    if (ret < 0) {
      cerr << "couldn't create delegate. err = " << ret << endl;
      return -1;
    }

    // Call the delegate to ManLib::Plus()
    cout << "Calling ManLib::Plus() through delegate..." << endl;

    double res = dele_plus(1, 2);
    cout << "ManLib::Plus(1, 2) returned " << res << endl;
  }

  {
    // Create the delegate to ManLib::Sum(double*, int)
    sum_ptr dele_sum;
    ret = coreclr_create_dele(coreclr_handle, domain_id, "manlib", "ManLib",
                              "Sum", reinterpret_cast<void **>(&dele_sum));
    if (ret < 0) {
      cerr << "couldn't create delegate. err = " << ret << endl;
      return -1;
    }

    // Call the delegate to ManLib::Sum()
    double nums[10];
    for (int i = 0; i < 10; i++) {
      nums[i] = i;
    }
    cout << "Calling ManLib::Sum() through delegate..." << endl;
    double sum = dele_sum(nums, 10);
    cout << "ManLib::Sum(1:10, 10) returned " << sum << endl;
  }

  {
    // Create the delegate to ManLib::Sum2(double*, int)
    sum_ptr dele_sum;
    ret = coreclr_create_dele(coreclr_handle, domain_id, "manlib", "ManLib",
                              "Sum2", reinterpret_cast<void **>(&dele_sum));
    if (ret < 0) {
      cerr << "couldn't create delegate. err = " << ret << endl;
      return -1;
    }

    // Call the delegate to ManLib::Sum()
    double nums[10];
    for (int i = 0; i < 10; i++) {
      nums[i] = i;
    }
    cout << "Calling ManLib::Sum2() through delegate..." << endl;
    double sum = dele_sum(nums, 10);
    cout << "ManLib::Sum2(1:10, 10) returned " << sum << endl;
  }

  dlclose(coreclr);
}